

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.c
# Opt level: O2

_Bool project(source origin,wchar_t rad,loc finish,wchar_t dam,wchar_t typ,wchar_t flg,
             wchar_t degrees_of_arc,uint8_t diameter_of_source,object *obj)

{
  ushort uVar1;
  bool bVar2;
  chunk_conflict *pcVar3;
  player *p;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t wVar6;
  uint uVar7;
  loc lVar8;
  square *psVar9;
  loc_conflict lVar10;
  loc lVar11;
  monster *pmVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  wchar_t wVar16;
  undefined4 in_register_00000014;
  long lVar17;
  uint uVar18;
  undefined4 in_register_00000084;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  anon_union_8_5_62f3dbed_for_which aVar25;
  source origin_00;
  source origin_01;
  source origin_02;
  source origin_03;
  source origin_04;
  _Bool did_hit;
  _Bool was_obvious;
  wchar_t local_1dd8;
  anon_enum_32 local_1dd4;
  anon_union_8_5_62f3dbed_for_which local_1dd0;
  ulong local_1dc8;
  int16_t local_1dba;
  ulong local_1db8;
  wchar_t x;
  ulong local_1da8;
  ulong local_1da0;
  void *local_1d98;
  wchar_t y;
  wchar_t local_1d84;
  loc local_1d80;
  loc_conflict local_1d78;
  loc local_1d70;
  ulong local_1d68;
  loc_conflict local_1d60;
  int local_1d54;
  undefined8 local_1d50;
  uint8_t *local_1d48;
  long local_1d40;
  wchar_t distance_to_grid [256];
  loc blast_grid [256];
  _Bool player_sees_grid [256];
  loc path_grid [512];
  
  p = player;
  local_1d50 = CONCAT44(in_register_00000084,dam);
  local_1da0 = CONCAT44(in_register_00000014,rad);
  origin_00.which = origin.which;
  origin_00.what = origin.what;
  uVar20 = (ulong)finish >> 0x20;
  local_1dba = player->timed[2];
  local_1dd8 = typ;
  local_1d98 = malloc((ulong)z_info->max_range * 4 + 4);
  handle_stuff(p);
  local_1db8 = uVar20;
  if ((flg & 1U) == 0) {
    origin_00._4_4_ = 0;
    lVar8 = origin_get_loc(origin_00);
    local_1d70 = (loc)((ulong)lVar8 & 0xffffffff);
    local_1d68 = (ulong)lVar8 >> 0x20;
    if ((ulong)lVar8 >> 0x20 == 0xffffffff && lVar8.x == L'\xffffffff') {
      local_1d70 = (loc)((ulong)finish & 0xffffffff);
      local_1d68 = uVar20;
    }
  }
  else {
    flg = flg & 0xfffffffe;
    local_1d70 = (loc)((ulong)finish & 0xffffffff);
    local_1d68 = uVar20;
  }
  uVar20 = local_1da0;
  wVar16 = flg & 0xfffffbf8U | 6;
  if ((flg & 0x400U) == 0) {
    wVar16 = flg;
  }
  if (degrees_of_arc != L'\0') {
    wVar16 = flg;
  }
  wVar6 = (wchar_t)local_1da0;
  if (wVar6 == L'\0') {
    wVar16 = flg;
  }
  uVar14 = (ulong)(uint)wVar16;
  lVar8 = (loc)((ulong)local_1d70 | local_1d68 << 0x20);
  _Var4 = loc_eq((loc_conflict)lVar8,(loc_conflict)finish);
  uVar24 = local_1db8;
  local_1dd4 = origin_00.what;
  local_1dd0 = origin_00.which;
  local_1da8 = uVar14;
  if (_Var4) {
    distance_to_grid[0] = L'\0';
    blast_grid[0].y = (wchar_t)local_1db8;
    blast_grid[0].x = finish.x;
    psVar9 = square(cave,finish);
    flag_on_dbg(psVar9->info,3,0x12,"square(cave, finish)->info","SQUARE_PROJECT");
    uVar22 = wVar16 & 2;
    local_1d78.x = 0;
    local_1d78.y = 0;
    uVar20 = 1;
  }
  else {
    wVar5 = project_path((chunk *)cave,path_grid,(uint)z_info->max_range,lVar8,finish,wVar16);
    uVar22 = wVar16 & 2;
    local_1d78 = (loc_conflict)(uVar20 & 0xffffffff);
    if (wVar5 < wVar6) {
      local_1d78.y = 0;
      local_1d78.x = wVar5;
    }
    if (uVar22 == 0) {
      local_1d78.y = 0;
      local_1d78.x = wVar5;
    }
    if (wVar6 < L'\x01') {
      local_1d78.y = 0;
      local_1d78.x = wVar5;
    }
    uVar24 = local_1d68;
    if (((uint)wVar16 >> 10 & 1) == 0) {
      _y = CONCAT71(stack0xffffffffffffe271,wVar6 < L'\x01');
      local_1d60.x = local_1d78.x - 1;
      local_1d60.y = 0;
      local_1d84 = CONCAT31(local_1d84._1_3_,-1 < (char)wVar16 && local_1dba == 0);
      lVar10.x = 0;
      lVar10.y = 0;
      x = 0;
      register0x00000004 = 0;
      if (0 < local_1d78.x) {
        _x = local_1d78;
      }
      uVar20 = 0;
      finish = local_1d70;
      for (; _x != lVar10; lVar10 = (loc_conflict)((long)lVar10 + 1)) {
        wVar16 = path_grid[(long)lVar10].x;
        lVar8.y = L'\0';
        lVar8.x = wVar16;
        wVar6 = path_grid[(long)lVar10].y;
        local_1db8 = uVar24;
        local_1d80 = finish;
        _Var4 = square_ispassable(cave,path_grid[(long)lVar10]);
        pcVar3 = cave;
        if ((!_Var4 && (char)y == '\0') && (uVar22 == 0)) {
          uVar22 = 0;
          uVar24 = local_1db8;
          finish = local_1d80;
          break;
        }
        if ((uVar22 != 0) || (local_1d60 == lVar10)) {
          local_1dc8 = (ulong)(int)uVar20;
          blast_grid[local_1dc8].y = wVar6;
          blast_grid[local_1dc8].x = wVar16;
          distance_to_grid[local_1dc8] = L'\0';
          lVar11 = (loc)loc(wVar16,wVar6);
          uVar20 = local_1dc8;
          psVar9 = square(pcVar3,lVar11);
          flag_on_dbg(psVar9->info,3,0x12,"square(cave, loc(x, y))->info","SQUARE_PROJECT");
          uVar20 = (ulong)((int)uVar20 + 1);
        }
        pcVar3 = cave;
        if ((char)local_1d84 != '\0') {
          local_1dc8 = uVar20;
          lVar11 = (loc)loc(wVar16,wVar6);
          uVar14 = local_1da8;
          _Var4 = square_isview(pcVar3,lVar11);
          uVar20 = local_1dc8;
          event_signal_bolt(EVENT_BOLT,local_1dd8,false,_Var4,uVar22 != 0,(wchar_t)local_1db8,
                            local_1d80.x,wVar6,wVar16);
        }
        uVar24 = (ulong)(uint)wVar6;
        finish = lVar8;
      }
    }
    else {
      uVar20 = 0;
      finish = local_1d70;
    }
  }
  uVar18 = (uint)uVar14;
  if ((0 < (wchar_t)local_1da0) && (uVar22 == 0)) {
    lVar17 = 0;
    if (((uVar18 >> 10 & 1) == 0) || (iVar15 = local_1d78.x, iVar15 == 0)) {
      lVar19 = 0;
      local_1db8 = uVar24;
    }
    else {
      uVar24 = local_1da0;
      if (0x13 < (uint)(wchar_t)local_1da0) {
        uVar24 = 0x14;
      }
      local_1da0 = uVar24 & 0xffffffff;
      iVar13 = iVar15 + -1;
      if (0x14 < iVar15) {
        iVar13 = 0x14;
      }
      lVar19 = (long)((path_grid[iVar13].y - (int)local_1d68) + 0x14);
      lVar17 = (long)((path_grid[iVar13].x - local_1d70.x) + 0x14);
      finish = local_1d70;
      local_1db8 = local_1d68 & 0xffffffff;
    }
    wVar6 = finish.x;
    wVar16 = (wchar_t)local_1db8;
    if ((int)uVar20 == 0) {
      distance_to_grid[0] = L'\0';
      lVar8 = (loc)((ulong)finish & 0xffffffff | local_1db8 << 0x20);
      blast_grid[0].x = wVar6;
      blast_grid[0].y = wVar16;
      psVar9 = square(cave,lVar8);
      flag_on_dbg(psVar9->info,3,0x12,"square(cave, centre)->info","SQUARE_PROJECT");
      uVar20 = 1;
    }
    else {
      lVar8 = (loc)((ulong)finish & 0xffffffff | local_1db8 << 0x20);
    }
    iVar15 = (int)local_1da0;
    local_1d48 = get_angle_to_grid[lVar19] + lVar17;
    local_1d54 = (degrees_of_arc + L'\x06') / 4;
    uVar23 = (ulong)local_1d78 & 0xffffffff;
    if (local_1d78.x < 1) {
      uVar23 = 0;
    }
    local_1d40 = (long)(wVar6 - iVar15);
    _y = (ulong)(iVar15 + wVar6);
    local_1d78 = (loc_conflict)(long)(iVar15 + wVar16);
    lVar10 = (loc_conflict)(long)(wVar16 - iVar15);
    local_1d80 = finish;
    while (uVar18 = (uint)uVar14, uVar24 = local_1db8, finish = local_1d80,
          (long)lVar10 <= (long)local_1d78) {
      local_1d60 = (loc_conflict)((long)((lVar10.x - (int)local_1d68) + 0x14) * 0x29);
      _x = lVar10;
      for (lVar17 = local_1d40; lVar17 <= (long)_y; lVar17 = lVar17 + 1) {
        wVar16 = (wchar_t)lVar17;
        lVar11 = (loc)loc(wVar16,x);
        _Var4 = loc_eq((loc_conflict)lVar11,(loc_conflict)lVar8);
        if (!_Var4) {
          if (0xfe < (int)uVar20) break;
          _Var4 = square_in_bounds(cave,lVar11);
          if (_Var4) {
            local_1dc8 = uVar20;
            if (((uVar14 & 4) != 0) || (_Var4 = square_ispassable(cave,lVar11), _Var4)) {
              _Var4 = square_isprojectable(cave,lVar11);
              if (!_Var4) {
                lVar19 = 0;
                do {
                  uVar20 = local_1dc8;
                  if (lVar19 == 8) goto LAB_001bd672;
                  lVar10 = loc_sum((loc_conflict)lVar11,(loc_conflict)ddgrid_ddd[lVar19]);
                  _Var4 = los(cave,(loc_conflict)lVar8,lVar10);
                  lVar19 = lVar19 + 1;
                } while (!_Var4);
              }
            }
            else {
              _Var4 = square_isprojectable(cave,lVar11);
              uVar20 = local_1dc8;
              if (!_Var4) goto LAB_001bd672;
            }
            wVar6 = distance((loc_conflict)lVar8,(loc_conflict)lVar11);
            uVar20 = local_1dc8;
            if (wVar6 <= (wchar_t)local_1da0) {
              bVar2 = false;
              local_1d84 = wVar6;
              for (uVar20 = 0; uVar14 = local_1da8, uVar23 != uVar20; uVar20 = uVar20 + 1) {
                _Var4 = loc_eq((loc_conflict)lVar11,(loc_conflict)path_grid[uVar20]);
                if (_Var4) {
                  bVar2 = true;
                }
              }
              if (((uint)local_1da8 >> 10 & 1) != 0) {
                iVar15 = (uint)get_angle_to_grid[0]
                               [(long)((wVar16 - local_1d70.x) + 0x14) + (long)local_1d60] -
                         (uint)*local_1d48;
                uVar22 = iVar15 + 0x5a;
                if (iVar15 < -0x5a) {
                  uVar22 = -(iVar15 + 0x5a);
                }
                uVar22 = uVar22 % 0xb4;
                iVar15 = 0x5a - uVar22;
                if (0x5a < uVar22) {
                  iVar15 = uVar22 - 0x5a;
                }
                if ((local_1d54 <= iVar15) && (uVar20 = local_1dc8, !bVar2)) goto LAB_001bd672;
              }
              _Var4 = los(cave,(loc_conflict)lVar8,(loc_conflict)lVar11);
              if ((_Var4) || (uVar20 = local_1dc8, bVar2)) {
                iVar15 = (int)local_1dc8;
                blast_grid[iVar15].y = x;
                blast_grid[iVar15].x = wVar16;
                distance_to_grid[iVar15] = local_1d84;
                psVar9 = square(cave,lVar11);
                flag_on_dbg(psVar9->info,3,0x12,"square(cave, grid)->info","SQUARE_PROJECT");
                uVar20 = (ulong)(iVar15 + 1);
              }
            }
          }
        }
LAB_001bd672:
      }
      lVar10 = (loc_conflict)((long)_x + 1);
    }
  }
  uVar1 = z_info->max_range;
  uVar22 = (uint)local_1d50;
  for (lVar17 = 0; lVar17 != (ulong)uVar1 + 1; lVar17 = lVar17 + 1) {
    if ((wchar_t)local_1da0 < lVar17) {
      uVar7 = 0;
    }
    else {
      iVar15 = (int)lVar17;
      if (diameter_of_source == '\0' || lVar17 == 0) {
        uVar7 = (int)(iVar15 + uVar22) / (iVar15 + 1);
      }
      else {
        uVar7 = (int)(diameter_of_source * uVar22) / (iVar15 + 1);
        if (uVar22 <= uVar7) {
          uVar7 = uVar22;
        }
      }
    }
    *(uint *)((long)local_1d98 + lVar17 * 4) = uVar7;
  }
  iVar15 = 0;
  for (wVar16 = L'\0'; wVar16 <= (wchar_t)local_1da0; wVar16 = wVar16 + L'\x01') {
    for (lVar17 = (long)iVar15; lVar17 < (int)uVar20; lVar17 = lVar17 + 1) {
      if (distance_to_grid[lVar17] == wVar16) {
        wVar6 = distance_to_grid[iVar15];
        lVar8 = blast_grid[iVar15];
        blast_grid[iVar15] = blast_grid[lVar17];
        distance_to_grid[iVar15] = wVar16;
        blast_grid[lVar17] = lVar8;
        distance_to_grid[lVar17] = wVar6;
        iVar15 = iVar15 + 1;
      }
    }
  }
  uVar23 = 0;
  uVar14 = 0;
  if (0 < (int)uVar20) {
    uVar14 = uVar20 & 0xffffffff;
  }
  local_1dc8 = uVar20;
  local_1d80 = finish;
  for (; wVar16 = local_1dd8, uVar14 != uVar23; uVar23 = uVar23 + 1) {
    _Var4 = panel_contains(blast_grid[uVar23].y,blast_grid[uVar23].x);
    if ((((!_Var4) || (_Var4 = square_isview(cave,blast_grid[uVar23]), !_Var4)) || (local_1dba != 0)
        ) || (_Var4 = true, (uVar18 & 0x80) != 0)) {
      _Var4 = false;
    }
    player_sees_grid[uVar23] = _Var4;
  }
  bVar21 = 0;
  event_signal_blast(EVENT_EXPLOSION,local_1dd8,(wchar_t)local_1dc8,distance_to_grid,false,
                     player_sees_grid,(loc_conflict *)blast_grid,
                     (loc_conflict)((ulong)local_1d80 & 0xffffffff | uVar24 << 0x20));
  if ((local_1da8 & 0x20) != 0) {
    bVar21 = 0;
    for (uVar20 = 0; uVar14 != uVar20; uVar20 = uVar20 + 1) {
      origin_02._4_4_ = 0;
      origin_02.what = local_1dd4;
      origin_02.which.trap = local_1dd0.trap;
      _Var4 = project_o(origin_02,distance_to_grid[uVar20],blast_grid[uVar20],
                        *(wchar_t *)((long)local_1d98 + (long)distance_to_grid[uVar20] * 4),wVar16,
                        obj);
      bVar21 = bVar21 | _Var4;
    }
  }
  aVar25 = local_1dd0;
  if ((local_1da8 & 0x40) != 0) {
    was_obvious = false;
    did_hit = false;
    _x = loc(0,0);
    _y = (ulong)_x >> 0x20;
    iVar15 = 0;
    for (uVar20 = 0; pcVar3 = cave, uVar14 != uVar20; uVar20 = uVar20 + 1) {
      _Var4 = square_isproject(cave,blast_grid[uVar20]);
      if ((_Var4) &&
         (pmVar12 = square_monster(cave,blast_grid[uVar20]), aVar25 = local_1dd0,
         pmVar12 != (monster *)0x0)) {
        origin_01._4_4_ = 0;
        origin_01.what = local_1dd4;
        origin_01.which.trap = local_1dd0.trap;
        project_m(origin_01,distance_to_grid[uVar20],blast_grid[uVar20],
                  *(wchar_t *)((long)local_1d98 + (long)distance_to_grid[uVar20] * 4),local_1dd8,
                  (wchar_t)local_1da8,&did_hit,&was_obvious);
        bVar21 = bVar21 | was_obvious;
        aVar25 = local_1dd0;
        if (did_hit == true) {
          iVar15 = iVar15 + 1;
          register0x00000004 = 0;
          x = (pmVar12->grid).x;
          _y = (ulong)(uint)(pmVar12->grid).y;
        }
      }
    }
    wVar16 = local_1dd8;
    if (iVar15 == 1 && local_1dd4 == SRC_PLAYER) {
      lVar8 = (loc)loc(x,(int)_y);
      aVar25 = local_1dd0;
      psVar9 = square(pcVar3,lVar8);
      pcVar3 = cave;
      wVar16 = local_1dd8;
      if (0 < psVar9->mon) {
        lVar8 = (loc)loc(x,(int)_y);
        aVar25 = local_1dd0;
        pmVar12 = square_monster(pcVar3,lVar8);
        _Var4 = monster_is_visible(pmVar12);
        wVar16 = local_1dd8;
        if (_Var4) {
          monster_race_track(player->upkeep,pmVar12->race);
          aVar25 = local_1dd0;
          health_track(player->upkeep,pmVar12);
          wVar16 = local_1dd8;
        }
      }
    }
  }
  if (((uint)local_1da8 >> 0xb & 1) != 0) {
    wVar6 = L'\0';
    if (local_1dd4 == SRC_MONSTER) {
      pmVar12 = cave_monster(cave,aVar25.grid.x);
      wVar16 = pmVar12->race->spell_power;
      _Var4 = monster_is_powerful(pmVar12);
      wVar6 = L'P';
      if (L'P' < wVar16) {
        wVar6 = wVar16;
      }
      if (!_Var4) {
        wVar6 = wVar16;
      }
    }
    uVar24 = 0;
    uVar20 = local_1da8 >> 0xe;
    do {
      aVar25 = local_1dd0;
      wVar16 = local_1dd8;
      if (uVar14 == uVar24) goto LAB_001bdace;
      origin_03._4_4_ = 0;
      origin_03.what = local_1dd4;
      origin_03.which.trap = local_1dd0.trap;
      _Var4 = project_p(origin_03,distance_to_grid[uVar24],blast_grid[uVar24],
                        *(wchar_t *)((long)local_1d98 + (long)distance_to_grid[uVar24] * 4),
                        local_1dd8,wVar6,(_Bool)((byte)uVar20 & 1));
      uVar24 = uVar24 + 1;
    } while (!_Var4);
    bVar21 = 1;
    aVar25 = local_1dd0;
    wVar16 = local_1dd8;
    if (player->is_dead == true) {
      free(local_1d98);
      bVar21 = 1;
      goto LAB_001bdb2c;
    }
  }
LAB_001bdace:
  if ((local_1da8 & 0x10) != 0) {
    for (uVar20 = 0; uVar14 != uVar20; uVar20 = uVar20 + 1) {
      origin_04._4_4_ = 0;
      origin_04.what = local_1dd4;
      origin_04.which.trap = aVar25.trap;
      _Var4 = project_f(origin_04,distance_to_grid[uVar20],blast_grid[uVar20],
                        *(wchar_t *)((long)local_1d98 + (long)distance_to_grid[uVar20] * 4),wVar16);
      bVar21 = bVar21 | _Var4;
    }
  }
  for (uVar20 = 0; uVar14 != uVar20; uVar20 = uVar20 + 1) {
    psVar9 = square(cave,blast_grid[uVar20]);
    flag_off(psVar9->info,3,0x12);
  }
  if (player->upkeep->update != 0) {
    update_stuff(player);
  }
  free(local_1d98);
LAB_001bdb2c:
  return (_Bool)(bVar21 & 1);
}

Assistant:

bool project(struct source origin, int rad, struct loc finish,
			 int dam, int typ, int flg,
			 int degrees_of_arc, uint8_t diameter_of_source,
			 const struct object *obj)
{
	int i, j, k, dist_from_centre;

	uint32_t dam_temp;

	struct loc centre;
	struct loc start;

	int n1y = 0;
	int n1x = 0;

	/* Assume the player sees nothing */
	bool notice = false;

	/* Notify the UI if it can draw this projection */
	bool drawing = false;

	/* Is the player blind? */
	bool blind = (player->timed[TMD_BLIND] ? true : false);

	/* Number of grids in the "path" */
	int num_path_grids = 0;

	/* Actual grids in the "path" */
	struct loc path_grid[512];

	/* Number of grids in the "blast area" (including the "beam" path) */
	int num_grids = 0;

	/* Coordinates of the affected grids */
	struct loc blast_grid[256];

	/* Distance to each of the affected grids. */
	int distance_to_grid[256];

	/* Player visibility of each of the affected grids. */
	bool player_sees_grid[256];

	/* Precalculated damage values for each distance. */
	int *dam_at_dist = malloc((z_info->max_range + 1) * sizeof(*dam_at_dist));

	/* Flush any pending output */
	handle_stuff(player);

	/* No projection path - jump to target */
	if (flg & PROJECT_JUMP) {
		start = finish;

		/* Clear the flag */
		flg &= ~(PROJECT_JUMP);
	} else {
		start = origin_get_loc(origin);

		/* Default to finish grid */
		if (start.y == -1 && start.x == -1) {
			start = finish;
		}
	}

	/* Default center of explosion (if any) */
	centre = start;

	/*
	 * An arc spell with no width and a non-zero radius is actually a
	 * beam of defined length.  Mark it as such.
	 */
	if ((flg & (PROJECT_ARC)) && (degrees_of_arc == 0) && (rad != 0)) {
		/* No longer an arc */
		flg &= ~(PROJECT_ARC);

		/* Now considered a beam */
		flg |= (PROJECT_BEAM);
		flg |= (PROJECT_THRU);
	}

	/*
	 * If a single grid is both start and finish (for example
	 * if PROJECT_JUMP is set), store it; otherwise, travel along the
	 * projection path.
	 */
	if (loc_eq(start, finish)) {
		blast_grid[num_grids] =  finish;
		centre = finish;
		distance_to_grid[num_grids] = 0;
		sqinfo_on(square(cave, finish)->info, SQUARE_PROJECT);
		num_grids++;
	} else {
		/* Start from caster */
		int y = start.y;
		int x = start.x;

		/* Calculate the projection path */
		num_path_grids = project_path(cave, path_grid, z_info->max_range, start,
									  finish, flg);

		/* Some beams have limited length. */
		if (flg & (PROJECT_BEAM)) {
			/* Use length limit, if any is given. */
			if ((rad > 0) && (rad < num_path_grids)) {
				num_path_grids = rad;
			}
		}


		/* Project along the path (except for arcs) */
		if (!(flg & (PROJECT_ARC))) {
			for (i = 0; i < num_path_grids; ++i) {
				int oy = y;
				int ox = x;

				int ny = path_grid[i].y;
				int nx = path_grid[i].x;

				/* Hack -- Balls explode before reaching walls. */
				if (!square_ispassable(cave, path_grid[i]) && (rad > 0) &&
					!(flg & (PROJECT_BEAM)))
					break;

				/* Advance */
				y = ny;
				x = nx;

				/* Beams collect all grids in the path, all other methods
				 * collect only the final grid in the path. */
				if (flg & (PROJECT_BEAM)) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = 0;
					sqinfo_on(square(cave, loc(x, y))->info, SQUARE_PROJECT);
					num_grids++;
				} else if (i == num_path_grids - 1) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = 0;
					sqinfo_on(square(cave, loc(x, y))->info, SQUARE_PROJECT);
					num_grids++;
				}

				/* Only do visuals if requested and within range limit. */
				if (!blind && !(flg & (PROJECT_HIDE))) {
					bool seen = square_isview(cave, loc(x, y));
					bool beam = flg & (PROJECT_BEAM);

					/* Tell the UI to display the bolt */
					event_signal_bolt(EVENT_BOLT, typ, drawing, seen, beam, oy,
									  ox, y, x);
				}
			}
		}

		/* Save the "blast epicenter" */
		centre.y = y;
		centre.x = x;
	}

	/* Now check for explosions.  Beams have already stored all the grids they
	 * will affect; all non-beam projections with positive radius explode in
	 * some way */
	if ((rad > 0) && (!(flg & (PROJECT_BEAM)))) {
		int y, x;

		/* Pre-calculate some things for arcs. */
		if ((flg & (PROJECT_ARC)) && (num_path_grids != 0)) {
			/* Explosion centers on the caster. */
			centre = start;

			/* The radius of arcs cannot be more than 20 */
			if (rad > 20)
				rad = 20;

			/* Ensure legal access into get_angle_to_grid table */
			if (num_path_grids < 21)
				i = num_path_grids - 1;
			else
				i = 20;

			/* Reorient the grid forming the end of the arc's centerline. */
			n1y = path_grid[i].y - centre.y + 20;
			n1x = path_grid[i].x - centre.x + 20;
		}

		/* If the explosion centre hasn't been saved already, save it now. */
		if (num_grids == 0) {
			blast_grid[num_grids] = centre;
			distance_to_grid[num_grids] = 0;
			sqinfo_on(square(cave, centre)->info, SQUARE_PROJECT);
			num_grids++;
		}

		/* Scan every grid that might possibly be in the blast radius. */
		for (y = centre.y - rad; y <= centre.y + rad; y++) {
			for (x = centre.x - rad; x <= centre.x + rad; x++) {
				struct loc grid = loc(x, y);
				bool on_path = false;

				/* Center grid has already been stored. */
				if (loc_eq(grid, centre))
					continue;

				/* Precaution: Stay within area limit. */
				if (num_grids >= 255)
					break;

				/* Ignore "illegal" locations */
				if (!square_in_bounds(cave, grid))
					continue;

				/* Most explosions are immediately stopped by walls. If
				 * PROJECT_THRU is set, walls can be affected if adjacent to
				 * a grid visible from the explosion centre - note that as of
				 * Angband 3.5.0 there are no such explosions - NRM.
				 * All explosions can affect one layer of terrain which is
				 * passable but not projectable */
				if ((flg & (PROJECT_THRU)) || square_ispassable(cave, grid)) {
					/* If this is a wall grid, ... */
					if (!square_isprojectable(cave, grid)) {
						bool can_see_one = false;
						/* Check neighbors */
						for (i = 0; i < 8; i++) {
							struct loc adj_grid = loc_sum(grid, ddgrid_ddd[i]);
							if (los(cave, centre, adj_grid)) {
								can_see_one = true;
								break;
							}
						}

						/* Require at least one adjacent grid in LOS. */
						if (!can_see_one)
							continue;
					}
				} else if (!square_isprojectable(cave, grid))
					continue;

				/* Must be within maximum distance. */
				dist_from_centre  = (distance(centre, grid));
				if (dist_from_centre > rad)
					continue;

				/* Mark grids which are on the projection path */
				for (i = 0; i < num_path_grids; i++) {
					if (loc_eq(grid, path_grid[i])) {
						on_path = true;
					}
				}

				/* Do we need to consider a restricted angle? */
				if (flg & (PROJECT_ARC)) {
					/* Use angle comparison to delineate an arc. */
					int n2y, n2x, tmp, rotate, diff;

					/* Reorient current grid for table access. */
					n2y = y - start.y + 20;
					n2x = x - start.x + 20;

					/* Find the angular difference (/2) between the lines to
					 * the end of the arc's center-line and to the current grid.
					 */
					rotate = 90 - get_angle_to_grid[n1y][n1x];
					tmp = ABS(get_angle_to_grid[n2y][n2x] + rotate) % 180;
					diff = ABS(90 - tmp);

					/* If difference is greater then that allowed, skip it,
					 * unless it's on the target path */
					if ((diff >= (degrees_of_arc + 6) / 4) && !on_path)
						continue;
				}

				/* Accept remaining grids if in LOS or on the projection path */
				if (los(cave, centre, grid) || on_path) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = dist_from_centre;
					sqinfo_on(square(cave, grid)->info, SQUARE_PROJECT);
					num_grids++;
				}
			}
		}
	}

	/* Calculate and store the actual damage at each distance. */
	for (i = 0; i <= z_info->max_range; i++) {
		if (i > rad) {
			/* No damage outside the radius. */
			dam_temp = 0;
		} else if ((!diameter_of_source) || (i == 0)) {
			/* Standard damage calc. for 10' source diameters, or at origin. */
			dam_temp = (dam + i) / (i + 1);
		} else {
			/* If a particular diameter for the source of the explosion's
			 * energy is given, it is full strength to that diameter and
			 * then reduces */
			dam_temp = (diameter_of_source * dam) / (i + 1);
			if (dam_temp > (uint32_t) dam) {
				dam_temp = dam;
			}
		}

		/* Store it. */
		dam_at_dist[i] = dam_temp;
	}


	/* Sort the blast grids by distance from the centre. */
	for (i = 0, k = 0; i <= rad; i++) {
		/* Collect all the grids of a given distance together. */
		for (j = k; j < num_grids; j++) {
			if (distance_to_grid[j] == i) {
				struct loc tmp;
				int tmp_d = distance_to_grid[k];
				tmp = blast_grid[k];

				blast_grid[k] = blast_grid[j];
				distance_to_grid[k] = distance_to_grid[j];

				blast_grid[j] = tmp;
				distance_to_grid[j] = tmp_d;

				/* Write to next slot */
				k++;
			}
		}
	}

	/* Establish which grids are visible - no blast visuals with PROJECT_HIDE */
	for (i = 0; i < num_grids; i++) {
		if (panel_contains(blast_grid[i].y, blast_grid[i].x) &&
			square_isview(cave, blast_grid[i]) &&
			!blind && !(flg & (PROJECT_HIDE))) {
			player_sees_grid[i] = true;
		} else {
			player_sees_grid[i] = false;
		}
	}

	/* Tell the UI to display the blast */
	event_signal_blast(EVENT_EXPLOSION, typ, num_grids, distance_to_grid,
					   drawing, player_sees_grid, blast_grid, centre);

	/* Affect objects on every relevant grid */
	if (flg & (PROJECT_ITEM)) {
		for (i = 0; i < num_grids; i++) {
			if (project_o(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ, obj)) {
				notice = true;
			}
		}
	}

	/* Check monsters */
	if (flg & (PROJECT_KILL)) {
		bool was_obvious = false;
		bool did_hit = false;
		int num_hit = 0;
		struct loc last_hit_grid = loc(0, 0);

		/* Scan for monsters */
		for (i = 0; i < num_grids; i++) {
			struct monster *mon = NULL;

			/* Check this monster hasn't been processed already */
			if (!square_isproject(cave, blast_grid[i]))
				continue;

			/* Check there is actually a monster here */
			mon = square_monster(cave, blast_grid[i]);
			if (mon == NULL)
				continue;

			/* Affect the monster in the grid */
			project_m(origin, distance_to_grid[i], blast_grid[i],
			          dam_at_dist[distance_to_grid[i]], typ, flg,
			          &did_hit, &was_obvious);
			if (was_obvious) {
				notice = true;
			}
			if (did_hit) {
				num_hit++;

				/* Monster location may have been updated by project_m() */
				last_hit_grid = mon->grid;
			}
		}

		/* Player affected one monster (without "jumping") */
		if (origin.what == SRC_PLAYER &&
				num_hit == 1 &&
				!(flg & PROJECT_JUMP)) {
			/* Location */
			int x = last_hit_grid.x;
			int y = last_hit_grid.y;

			/* Track if possible */
			if (square(cave, loc(x, y))->mon > 0) {
				struct monster *mon = square_monster(cave, loc(x, y));

				/* Recall and track */
				if (monster_is_visible(mon)) {
					monster_race_track(player->upkeep, mon->race);
					health_track(player->upkeep, mon);
				}
			}
		}
	}

	/* Look for the player, affect them when found */
	if (flg & (PROJECT_PLAY)) {
		/* Set power */
		int power = 0;
		if (origin.what == SRC_MONSTER) {
			struct monster *mon = cave_monster(cave, origin.which.monster);
			power = mon->race->spell_power;

			/* Breaths from powerful monsters get power effects as well */
			if (monster_is_powerful(mon))
				power = MAX(power, 80);
		}
		for (i = 0; i < num_grids; i++) {
			if (project_p(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ, power,
						  flg & PROJECT_SELF)) {
				notice = true;
				if (player->is_dead) {
					free(dam_at_dist);
					return notice;
				}
				break;
			}
		}
	}

	/* Affect features in every relevant grid */
	if (flg & (PROJECT_GRID)) {
		for (i = 0; i < num_grids; i++) {
			if (project_f(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ)) {
				notice = true;
			}
		}
	}

	/* Clear all the processing marks. */
	for (i = 0; i < num_grids; i++) {
		/* Clear the mark */
		sqinfo_off(square(cave, blast_grid[i])->info, SQUARE_PROJECT);
	}

	/* Update stuff if needed */
	if (player->upkeep->update) update_stuff(player);

	free(dam_at_dist);

	/* Return "something was noticed" */
	return (notice);
}